

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O0

BCPos bcemit_jmp(FuncState *fs)

{
  BCPos BVar1;
  BCIns *ip;
  BCPos j;
  BCPos jpc;
  FuncState *fs_local;
  
  ip._4_4_ = fs->jpc;
  BVar1 = fs->pc;
  ip._0_4_ = BVar1 - 1;
  fs->jpc = 0xffffffff;
  _j = fs;
  if (((int)(uint)ip < (int)fs->lasttarget) || ((fs->bcbase[(uint)ip].ins & 0xff) != 0x32)) {
    ip._0_4_ = bcemit_INS(fs,fs->freereg << 8 | 0x7fff0058);
  }
  else {
    *(undefined2 *)((long)&fs->bcbase[(uint)ip].ins + 2) = 0x7fff;
    fs->lasttarget = BVar1;
  }
  jmp_append(_j,(BCPos *)&ip,ip._4_4_);
  return (uint)ip;
}

Assistant:

static BCPos bcemit_jmp(FuncState *fs)
{
  BCPos jpc = fs->jpc;
  BCPos j = fs->pc - 1;
  BCIns *ip = &fs->bcbase[j].ins;
  fs->jpc = NO_JMP;
  if ((int32_t)j >= (int32_t)fs->lasttarget && bc_op(*ip) == BC_UCLO) {
    setbc_j(ip, NO_JMP);
    fs->lasttarget = j+1;
  } else {
    j = bcemit_AJ(fs, BC_JMP, fs->freereg, NO_JMP);
  }
  jmp_append(fs, &j, jpc);
  return j;
}